

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svsetbase.h
# Opt level: O3

void __thiscall soplex::SVSetBase<double>::deleteVec(SVSetBase<double> *this,DLPSV *ps)

{
  int *piVar1;
  int iVar2;
  
  if ((this->list).super_IsList<soplex::SVSetBase<double>::DLPSV>.the_last == ps) {
    iVar2 = (ps->super_SVectorBase<double>).memsize;
    piVar1 = &(this->super_ClassArray<soplex::Nonzero<double>_>).thesize;
    *piVar1 = *piVar1 - iVar2;
    iVar2 = (ps->super_SVectorBase<double>).memused - iVar2;
  }
  else {
    if ((this->list).super_IsList<soplex::SVSetBase<double>::DLPSV>.the_first != ps) {
      piVar1 = &(ps->theprev->super_SVectorBase<double>).memsize;
      *piVar1 = *piVar1 + (ps->super_SVectorBase<double>).memsize;
    }
    iVar2 = (ps->super_SVectorBase<double>).memused;
  }
  updateUnusedMemEstimation(this,iVar2);
  IdList<soplex::SVSetBase<double>::DLPSV>::remove(&this->list,(char *)ps);
  return;
}

Assistant:

void deleteVec(DLPSV* ps)
   {
      /* delete last entries */
      if(ps == list.last())
      {
         SVSetBaseArray::removeLast(ps->max());

         // decrease counter of unused memory
#ifdef SOPLEX_DEBUG
         SPxOut::debug(this, "deleteVec (1), this = {} : updateUnusedMemEstimation -= {}\n", (void*)this,
                       ps->max() - ps->size());
#endif
         updateUnusedMemEstimation(ps->size() - ps->max());
      }
      /* merge space of predecessor with position which will be deleted, therefore we do not need to delete any memory
       * or do an expensive memory reallocation
       */
      else if(ps != list.first())
      {
         SVectorBase<R>* prev = ps->prev();
         int sz = prev->size();

         prev->setMem(prev->max() + ps->max(), prev->mem());
         prev->set_size(sz);

         // increase counter of unused memory
#ifdef SOPLEX_DEBUG
         SPxOut::debug(this, "deleteVec (2), this = {} : updateUnusedMemEstimation += {}\n", (void*)this,
                       ps->size());
#endif
         updateUnusedMemEstimation(ps->size());
      }
      /* simply remove the front entries; we do not shift the second vector to the front, because we count the unused
       * memory exactly and rely on the automatic call of memPack()
       */
      else
      {
         // increase counter of unused memory
#ifdef SOPLEX_DEBUG
         SPxOut::debug(this, "deleteVec (3), this = {} : updateUnusedMemEstimation += {}\n", (void*)this,
                       ps->size());
#endif
         updateUnusedMemEstimation(ps->size());
      }

      list.remove(ps);
   }